

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

void __thiscall LiteScript::Class::Inherit(Class *this,Variable *v)

{
  undefined8 *puVar1;
  Class *pCVar2;
  pointer ppVar3;
  pointer ppVar4;
  bool bVar5;
  Object *pOVar6;
  Type *this_00;
  long lVar7;
  Variable VStack_38;
  
  pOVar6 = Variable::operator->(v);
  this_00 = Object::GetType(pOVar6);
  bVar5 = Type::operator!=(this_00,(Type *)_type_class);
  if (!bVar5) {
    pOVar6 = Variable::operator->(v);
    pCVar2 = (Class *)pOVar6->data;
    if (pCVar2 != this) {
      Variable::Variable(&VStack_38,v);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
      emplace_back<LiteScript::Variable>(&this->inherit,&VStack_38);
      Variable::~Variable(&VStack_38);
      ppVar3 = (pCVar2->s_members).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar4 = (pCVar2->s_members).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (lVar7 = 0; (((long)ppVar3 - (long)ppVar4) / 0x30 & 0xffffffffU) * 0x30 - lVar7 != 0;
          lVar7 = lVar7 + 0x30) {
        puVar1 = (undefined8 *)
                 ((long)&(((pCVar2->s_members).
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                 lVar7);
        AddStatic(this,(char *)*puVar1,(Variable *)(puVar1 + 4));
      }
      ppVar3 = (pCVar2->us_members).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar4 = (pCVar2->us_members).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (lVar7 = 0; (((long)ppVar3 - (long)ppVar4) / 0x30 & 0xffffffffU) * 0x30 - lVar7 != 0;
          lVar7 = lVar7 + 0x30) {
        puVar1 = (undefined8 *)
                 ((long)&(((pCVar2->us_members).
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                 lVar7);
        AddUnstatic(this,(char *)*puVar1,(Variable *)(puVar1 + 4));
      }
    }
  }
  return;
}

Assistant:

void LiteScript::Class::Inherit(const Variable &v) {
    if (v->GetType() != Type::CLASS)
        return;
    const Class& C = v->GetData<Class>();
    if (this == &C)
        return;
    this->inherit.push_back(Variable(v));
    for (unsigned int i = 0, sz = C.s_members.size(); i < sz; i++)
        this->AddStatic(C.s_members[i].first.c_str(), C.s_members[i].second);
    for (unsigned int i = 0, sz = C.us_members.size(); i < sz; i++)
        this->AddUnstatic(C.us_members[i].first.c_str(), C.us_members[i].second);
}